

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::copy
          (SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  pointer ppEVar1;
  byte *pbVar2;
  long __d1;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  
  sVar3 = this->len;
  if (sVar3 == 0) {
    pbVar2 = (byte *)0x0;
  }
  else {
    pbVar2 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar2 + sVar3 * 8) {
      pbVar2 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar3 << 3,8);
      sVar3 = this->len;
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar2 + sVar3 * 8;
    }
    if (0 < (long)sVar3) {
      ppEVar1 = this->data_;
      uVar4 = sVar3 + 1;
      lVar5 = 0;
      do {
        *(undefined8 *)(pbVar2 + lVar5) = *(undefined8 *)((long)ppEVar1 + lVar5);
        uVar4 = uVar4 - 1;
        lVar5 = lVar5 + 8;
      } while (1 < uVar4);
    }
  }
  return (int)pbVar2;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }